

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::value_t,_toml::error_info> *
toml::detail::guess_number_type<toml::type_config>(location *first,context<toml::type_config> *ctx)

{
  initializer_list<unsigned_char> cs;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  char_type_conflict cVar5;
  size_t sVar6;
  context<toml::type_config> *in_RDX;
  result<toml::value_t,_toml::error_info> *in_RDI;
  source_location src;
  source_location src_8;
  source_location src_7;
  source_location src_6;
  source_location src_5;
  source_location src_4;
  source_location src_3;
  char_type_conflict c_1;
  region int_reg;
  source_location src_2;
  source_location src_1;
  char_type_conflict c;
  char_type_conflict curr;
  location loc;
  spec *spec;
  source_location *in_stack_ffffffffffffd808;
  failure_type *f;
  source_location *in_stack_ffffffffffffd810;
  size_t in_stack_ffffffffffffd818;
  location *in_stack_ffffffffffffd820;
  location *in_stack_ffffffffffffd828;
  location *in_stack_ffffffffffffd830;
  undefined8 in_stack_ffffffffffffd838;
  undefined7 in_stack_ffffffffffffd840;
  char_type_conflict in_stack_ffffffffffffd847;
  either *in_stack_ffffffffffffd848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_ffffffffffffd868;
  char_type_conflict in_stack_ffffffffffffd86f;
  location *in_stack_ffffffffffffd878;
  region *in_stack_ffffffffffffd880;
  region *in_stack_ffffffffffffd888;
  source_location *in_stack_ffffffffffffd890;
  spec *in_stack_ffffffffffffd8a8;
  spec *in_stack_ffffffffffffd8e8;
  location *in_stack_ffffffffffffd900;
  sequence *in_stack_ffffffffffffd908;
  bool local_26ce;
  bool local_26cc;
  bool local_26ca;
  spec *in_stack_ffffffffffffd938;
  bool local_26ab;
  bool local_268c;
  undefined6 in_stack_ffffffffffffd9c8;
  undefined1 in_stack_ffffffffffffd9ce;
  source_location *in_stack_ffffffffffffd9d0;
  string *in_stack_ffffffffffffd9d8;
  undefined5 in_stack_ffffffffffffd9e8;
  undefined1 in_stack_ffffffffffffd9ed;
  result<toml::value_t,_toml::error_info> *msg;
  source_location *in_stack_ffffffffffffda00;
  string *in_stack_ffffffffffffda08;
  source_location *in_stack_ffffffffffffda10;
  string *in_stack_ffffffffffffda18;
  string *in_stack_ffffffffffffda60;
  location *in_stack_ffffffffffffda68;
  character_either *in_stack_ffffffffffffda70;
  string *in_stack_ffffffffffffda78;
  allocator<char> local_2559 [81];
  spec *in_stack_ffffffffffffdaf8;
  failure_type local_24e0 [3];
  allocator<char> local_23a1 [40];
  allocator<char> local_2379 [160];
  allocator<char> local_22d9 [440];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2121;
  allocator<char> local_20f9 [160];
  allocator<char> local_2059 [438];
  undefined1 local_1ea3;
  value_type local_1ea2;
  undefined1 local_1ea1 [40];
  region local_1e79;
  region local_1dd9 [4];
  allocator<char> local_1c21 [40];
  allocator<char> local_1bf9 [160];
  allocator<char> local_1b59 [121];
  source_location local_1ae0 [2];
  allocator<char> local_19a1 [40];
  allocator<char> local_1979 [264];
  allocator<char> local_1871 [216];
  allocator<char> local_1799 [40];
  allocator<char> local_1771 [264];
  allocator<char> local_1669 [216];
  allocator<char> local_1591 [160];
  allocator<char> local_14f1 [440];
  allocator<char> local_1339 [160];
  allocator<char> local_1299 [440];
  byte local_10e1;
  byte local_10b9;
  byte local_1091;
  undefined1 local_106c;
  value_type local_106b;
  byte local_106a;
  byte local_1069;
  byte local_fd9;
  region local_fb8;
  undefined1 local_f4b;
  value_type local_f4a;
  allocator<char> local_f49 [160];
  allocator<char> local_ea9 [437];
  undefined1 local_cf4;
  value_type local_cf3;
  byte local_cf2;
  byte local_cf1;
  undefined1 local_bdb;
  value_type local_bda;
  allocator<char> local_bd9 [160];
  allocator<char> local_b39 [437];
  undefined1 local_984;
  value_type local_983;
  byte local_982;
  byte local_981;
  undefined1 local_86a;
  value_type local_869;
  undefined1 local_7db;
  value_type local_7da;
  allocator<char> local_7d9 [110];
  undefined1 local_76b;
  undefined1 local_76a;
  undefined1 local_769;
  undefined1 *local_768;
  undefined8 local_760;
  allocator<char> local_731 [216];
  allocator<char> local_659 [144];
  allocator<char> local_5c9 [216];
  allocator<char> local_4f1 [144];
  allocator<char> local_461 [216];
  byte local_389;
  undefined1 local_2fb;
  value_type local_2fa;
  allocator<char> local_2f9 [144];
  allocator<char> local_269 [216];
  char_type_conflict local_191;
  int local_104;
  undefined1 local_fe;
  value_type local_fd;
  spec *local_20;
  
  msg = in_RDI;
  local_20 = context<toml::type_config>::toml_spec(in_RDX);
  location::location(in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
  syntax::offset_datetime((spec *)in_stack_ffffffffffffd888);
  sequence::scan(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900);
  bVar1 = region::is_ok((region *)0x6e89af);
  region::~region((region *)in_stack_ffffffffffffd810);
  sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
  if ((bVar1 & 1) != 0) {
    local_fe = 5;
    local_fd = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_fd);
    local_104 = 1;
    goto LAB_006ec140;
  }
  location::operator=((location *)in_stack_ffffffffffffd810,(location *)in_stack_ffffffffffffd808);
  syntax::local_datetime((spec *)in_stack_ffffffffffffd888);
  sequence::scan(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900);
  bVar2 = region::is_ok((region *)0x6e8abc);
  region::~region((region *)in_stack_ffffffffffffd810);
  sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
  if ((bVar2 & 1) != 0) {
    local_191 = location::current((location *)in_stack_ffffffffffffd808);
    if ((local_191 == '+') || (local_191 == '-')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
      syntax::time_offset(in_stack_ffffffffffffd938);
      location::location(in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
      make_syntax_error<toml::detail::either>
                (in_stack_ffffffffffffda78,(either *)in_stack_ffffffffffffda70,
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda60);
      err<toml::error_info>
                ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
      result<toml::value_t,_toml::error_info>::result
                ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                 (failure_type *)in_stack_ffffffffffffd808);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6e8c33);
      error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd810);
      std::allocator<char>::~allocator(local_2f9);
      location::~location((location *)in_stack_ffffffffffffd810);
      either::~either((either *)in_stack_ffffffffffffd810);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd810);
      std::allocator<char>::~allocator(local_269);
      local_104 = 1;
    }
    else {
      local_2fb = 6;
      local_2fa = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
      result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_2fa);
      local_104 = 1;
    }
    goto LAB_006ec140;
  }
  location::operator=((location *)in_stack_ffffffffffffd810,(location *)in_stack_ffffffffffffd808);
  syntax::local_date(in_stack_ffffffffffffd8e8);
  sequence::scan(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900);
  bVar3 = region::is_ok((region *)0x6e8e59);
  region::~region((region *)in_stack_ffffffffffffd810);
  sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
  if ((bVar3 & 1) != 0) {
    bVar4 = location::eof((location *)in_stack_ffffffffffffd810);
    if (!bVar4) {
      local_389 = location::current((location *)in_stack_ffffffffffffd808);
      if ((local_389 == 0x54) || (local_389 == 0x74)) {
        location::advance(in_stack_ffffffffffffd820,in_stack_ffffffffffffd818);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        syntax::local_time((spec *)in_stack_ffffffffffffda68);
        location::location(in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        make_syntax_error<toml::detail::sequence>
                  (in_stack_ffffffffffffda78,(sequence *)in_stack_ffffffffffffda70,
                   in_stack_ffffffffffffda68,in_stack_ffffffffffffda60);
        err<toml::error_info>
                  ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
        result<toml::value_t,_toml::error_info>::result
                  ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                   (failure_type *)in_stack_ffffffffffffd808);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6e8ff7);
        error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_4f1);
        location::~location((location *)in_stack_ffffffffffffd810);
        sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_461);
        local_104 = 1;
        goto LAB_006ec140;
      }
      if (local_389 == 0x20) {
        location::advance(in_stack_ffffffffffffd820,in_stack_ffffffffffffd818);
        bVar4 = location::eof((location *)in_stack_ffffffffffffd810);
        if (((!bVar4) &&
            (bVar1 = location::current((location *)in_stack_ffffffffffffd808), 0x2f < bVar1)) &&
           (bVar1 = location::current((location *)in_stack_ffffffffffffd808), bVar1 < 0x3a)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          syntax::local_time((spec *)in_stack_ffffffffffffda68);
          location::location(in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          make_syntax_error<toml::detail::sequence>
                    (in_stack_ffffffffffffda78,(sequence *)in_stack_ffffffffffffda70,
                     in_stack_ffffffffffffda68,in_stack_ffffffffffffda60);
          err<toml::error_info>
                    ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
          result<toml::value_t,_toml::error_info>::result
                    ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                     (failure_type *)in_stack_ffffffffffffd808);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6e9312);
          error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_659);
          location::~location((location *)in_stack_ffffffffffffd810);
          sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_5c9);
          local_104 = 1;
          goto LAB_006ec140;
        }
      }
      if ((0x2f < local_389) && (local_389 < 0x3a)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        local_76b = 0x54;
        local_76a = 0x74;
        local_769 = 0x20;
        local_768 = &local_76b;
        local_760 = 3;
        cs._M_len._0_7_ = in_stack_ffffffffffffd840;
        cs._M_array = (iterator)in_stack_ffffffffffffd838;
        cs._M_len._7_1_ = in_stack_ffffffffffffd847;
        character_either::character_either((character_either *)in_stack_ffffffffffffd830,cs);
        location::location(in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        make_syntax_error<toml::detail::character_either>
                  (in_stack_ffffffffffffda78,in_stack_ffffffffffffda70,in_stack_ffffffffffffda68,
                   in_stack_ffffffffffffda60);
        err<toml::error_info>
                  ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
        result<toml::value_t,_toml::error_info>::result
                  ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                   (failure_type *)in_stack_ffffffffffffd808);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6e95db);
        error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_7d9);
        location::~location((location *)in_stack_ffffffffffffd810);
        character_either::~character_either((character_either *)in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_731);
        local_104 = 1;
        goto LAB_006ec140;
      }
    }
    local_7db = 7;
    local_7da = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_7da);
    local_104 = 1;
    goto LAB_006ec140;
  }
  location::operator=((location *)in_stack_ffffffffffffd810,(location *)in_stack_ffffffffffffd808);
  syntax::local_time((spec *)in_stack_ffffffffffffda68);
  sequence::scan(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900);
  bVar4 = region::is_ok((region *)0x6e97c4);
  region::~region((region *)in_stack_ffffffffffffd810);
  sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
  if (bVar4) {
    local_86a = 8;
    local_869 = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
    result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_869);
    local_104 = 1;
    goto LAB_006ec140;
  }
  location::operator=((location *)in_stack_ffffffffffffd810,(location *)in_stack_ffffffffffffd808);
  syntax::floating((spec *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffd9ed,
                                                                  in_stack_ffffffffffffd9e8))));
  either::scan(in_stack_ffffffffffffd848,
               (location *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
  bVar4 = region::is_ok((region *)0x6e98b5);
  region::~region((region *)in_stack_ffffffffffffd810);
  either::~either((either *)in_stack_ffffffffffffd810);
  if (bVar4) {
    bVar4 = location::eof((location *)in_stack_ffffffffffffd810);
    if ((bVar4) || (cVar5 = location::current((location *)in_stack_ffffffffffffd808), cVar5 != '_'))
    {
      local_bdb = 3;
      local_bda = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
      result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_bda);
      local_104 = 1;
    }
    else {
      local_981 = 0;
      local_982 = 0;
      local_268c = false;
      if ((local_20->ext_num_suffix & 1U) != 0) {
        syntax::num_suffix((spec *)in_stack_ffffffffffffd908);
        local_981 = 1;
        sequence::scan(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900);
        local_982 = 1;
        local_268c = region::is_ok((region *)0x6e99a0);
      }
      if ((local_982 & 1) != 0) {
        region::~region((region *)in_stack_ffffffffffffd810);
      }
      if ((local_981 & 1) != 0) {
        sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
      }
      if (local_268c == false) {
        region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
        source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
        region::~region((region *)in_stack_ffffffffffffd810);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        make_error_info<char_const(&)[105]>
                  (in_stack_ffffffffffffda18,in_stack_ffffffffffffda10,in_stack_ffffffffffffda08,
                   &in_stack_ffffffffffffda00->is_ok_);
        err<toml::error_info>
                  ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
        result<toml::value_t,_toml::error_info>::result
                  ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                   (failure_type *)in_stack_ffffffffffffd808);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6e9bb7);
        error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_bd9);
        source_location::~source_location(in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_b39);
        local_104 = 1;
        source_location::~source_location(in_stack_ffffffffffffd810);
      }
      else {
        local_984 = 3;
        local_983 = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
        result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_983);
        local_104 = 1;
      }
    }
    goto LAB_006ec140;
  }
  location::operator=((location *)in_stack_ffffffffffffd810,(location *)in_stack_ffffffffffffd808);
  if ((local_20->ext_hex_float & 1U) != 0) {
    syntax::hex_floating(in_stack_ffffffffffffdaf8);
    sequence::scan(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900);
    bVar4 = region::is_ok((region *)0x6e9dbd);
    region::~region((region *)in_stack_ffffffffffffd810);
    sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
    if (bVar4) {
      bVar4 = location::eof((location *)in_stack_ffffffffffffd810);
      if ((bVar4) ||
         (cVar5 = location::current((location *)in_stack_ffffffffffffd808), cVar5 != '_')) {
        local_f4b = 3;
        local_f4a = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
        result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_f4a);
        local_104 = 1;
      }
      else {
        local_cf1 = 0;
        local_cf2 = 0;
        local_26ab = false;
        if ((local_20->ext_num_suffix & 1U) != 0) {
          syntax::num_suffix((spec *)in_stack_ffffffffffffd908);
          local_cf1 = 1;
          sequence::scan(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900);
          local_cf2 = 1;
          local_26ab = region::is_ok((region *)0x6e9ea8);
        }
        if ((local_cf2 & 1) != 0) {
          region::~region((region *)in_stack_ffffffffffffd810);
        }
        if ((local_cf1 & 1) != 0) {
          sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
        }
        if (local_26ab == false) {
          region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
          source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
          region::~region((region *)in_stack_ffffffffffffd810);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          make_error_info<char_const(&)[105]>
                    (in_stack_ffffffffffffda18,in_stack_ffffffffffffda10,in_stack_ffffffffffffda08,
                     &in_stack_ffffffffffffda00->is_ok_);
          err<toml::error_info>
                    ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
          result<toml::value_t,_toml::error_info>::result
                    ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                     (failure_type *)in_stack_ffffffffffffd808);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6ea0bf);
          error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_f49);
          source_location::~source_location(in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_ea9);
          local_104 = 1;
          source_location::~source_location(in_stack_ffffffffffffd810);
        }
        else {
          local_cf4 = 3;
          local_cf3 = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
          result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_cf3);
          local_104 = 1;
        }
      }
      goto LAB_006ec140;
    }
    location::operator=((location *)in_stack_ffffffffffffd810,(location *)in_stack_ffffffffffffd808)
    ;
  }
  syntax::integer(in_stack_ffffffffffffd8a8);
  either::scan(in_stack_ffffffffffffd848,
               (location *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
  either::~either((either *)in_stack_ffffffffffffd810);
  bVar4 = region::operator_cast_to_bool((region *)0x6ea2c2);
  if (bVar4) {
    bVar4 = location::eof((location *)in_stack_ffffffffffffd810);
    if (bVar4) {
LAB_006eb82d:
      local_1ea3 = 2;
      local_1ea2 = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
      result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_1ea2);
      local_104 = 1;
    }
    else {
      local_fd9 = location::current((location *)in_stack_ffffffffffffd808);
      if (local_fd9 == 0x5f) {
        local_1069 = 0;
        local_106a = 0;
        local_26ca = false;
        if ((local_20->ext_num_suffix & 1U) != 0) {
          syntax::num_suffix((spec *)in_stack_ffffffffffffd908);
          local_1069 = 1;
          sequence::scan(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900);
          local_106a = 1;
          local_26ca = region::is_ok((region *)0x6ea391);
        }
        if ((local_106a & 1) != 0) {
          region::~region((region *)in_stack_ffffffffffffd810);
        }
        if ((local_1069 & 1) != 0) {
          sequence::~sequence((sequence *)in_stack_ffffffffffffd810);
        }
        if (local_26ca == false) {
          sVar6 = region::length(&local_fb8);
          local_1091 = 0;
          local_10b9 = 0;
          local_10e1 = 0;
          local_26cc = false;
          if (sVar6 < 3) {
            region::as_string_abi_cxx11_
                      ((region *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
            local_1091 = 1;
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffd810,&in_stack_ffffffffffffd808->is_ok_)
            ;
            local_26ce = true;
            if (!bVar4) {
              region::as_string_abi_cxx11_
                        ((region *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
              local_10b9 = 1;
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffd810,
                                      &in_stack_ffffffffffffd808->is_ok_);
              local_26ce = true;
              if (!bVar4) {
                region::as_string_abi_cxx11_
                          ((region *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
                local_10e1 = 1;
                local_26ce = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_ffffffffffffd810,
                                             &in_stack_ffffffffffffd808->is_ok_);
              }
            }
            local_26cc = local_26ce;
          }
          if ((local_10e1 & 1) != 0) {
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd810);
          }
          if ((local_10b9 & 1) != 0) {
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd810);
          }
          if ((local_1091 & 1) != 0) {
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd810);
          }
          if (local_26cc == false) {
            region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
            source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
            region::~region((region *)in_stack_ffffffffffffd810);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
            source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
            make_error_info<char_const(&)[96]>
                      (in_stack_ffffffffffffda18,in_stack_ffffffffffffda10,in_stack_ffffffffffffda08
                       ,&in_stack_ffffffffffffda00->is_ok_);
            err<toml::error_info>
                      ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
            result<toml::value_t,_toml::error_info>::result
                      ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                       (failure_type *)in_stack_ffffffffffffd808);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6eaa79);
            error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd810);
            std::allocator<char>::~allocator(local_1591);
            source_location::~source_location(in_stack_ffffffffffffd810);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd810);
            std::allocator<char>::~allocator(local_14f1);
            local_104 = 1;
            source_location::~source_location(in_stack_ffffffffffffd810);
          }
          else {
            region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
            source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
            region::~region((region *)in_stack_ffffffffffffd810);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
            source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
            make_error_info<char_const(&)[96]>
                      (in_stack_ffffffffffffda18,in_stack_ffffffffffffda10,in_stack_ffffffffffffda08
                       ,&in_stack_ffffffffffffda00->is_ok_);
            err<toml::error_info>
                      ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
            result<toml::value_t,_toml::error_info>::result
                      ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                       (failure_type *)in_stack_ffffffffffffd808);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6ea769);
            error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd810);
            std::allocator<char>::~allocator(local_1339);
            source_location::~source_location(in_stack_ffffffffffffd810);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd810);
            std::allocator<char>::~allocator(local_1299);
            local_104 = 1;
            source_location::~source_location(in_stack_ffffffffffffd810);
          }
        }
        else {
          local_106c = 2;
          local_106b = (value_type)ok<toml::value_t>(&in_stack_ffffffffffffd808->is_ok_);
          result<toml::value_t,_toml::error_info>::result(in_RDI,(success_type)local_106b);
          local_104 = 1;
        }
      }
      else if ((local_fd9 < 0x30) || (0x39 < local_fd9)) {
        if ((local_fd9 == 0x3a) || (local_fd9 == 0x2d)) {
          region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
          source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
          region::~region((region *)in_stack_ffffffffffffd810);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          make_error_info<std::__cxx11::string>
                    (in_stack_ffffffffffffda08,in_stack_ffffffffffffda00,(string *)msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
          in_stack_ffffffffffffd890 = local_1ae0;
          err<toml::error_info>
                    ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
          result<toml::value_t,_toml::error_info>::result
                    ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                     (failure_type *)in_stack_ffffffffffffd808);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6eb371);
          error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_1c21);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_1bf9);
          source_location::~source_location(in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_1b59);
          local_104 = 1;
          source_location::~source_location(in_stack_ffffffffffffd810);
        }
        else {
          if (((local_fd9 != 0x2e) && (local_fd9 != 0x65)) && (local_fd9 != 0x45))
          goto LAB_006eb82d;
          region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
          source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
          region::~region((region *)in_stack_ffffffffffffd810);
          in_stack_ffffffffffffd888 = local_1dd9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
          in_stack_ffffffffffffd880 = (region *)(local_1ea1 + 0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          in_stack_ffffffffffffd878 = (location *)local_1ea1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          make_error_info<std::__cxx11::string>
                    (in_stack_ffffffffffffda08,in_stack_ffffffffffffda00,(string *)msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
          err<toml::error_info>
                    ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
          result<toml::value_t,_toml::error_info>::result
                    ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                     (failure_type *)in_stack_ffffffffffffd808);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6eb687);
          error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator((allocator<char> *)local_1ea1);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator((allocator<char> *)(local_1ea1 + 0x28));
          source_location::~source_location(in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator((allocator<char> *)local_1dd9);
          local_104 = 1;
          source_location::~source_location(in_stack_ffffffffffffd810);
        }
      }
      else {
        cVar5 = location::current((location *)in_stack_ffffffffffffd808);
        if (cVar5 == '0') {
          location::retrace((location *)in_stack_ffffffffffffd810);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
          source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          make_error_info<std::__cxx11::string>
                    (in_stack_ffffffffffffda08,in_stack_ffffffffffffda00,(string *)msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
          err<toml::error_info>
                    ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
          result<toml::value_t,_toml::error_info>::result
                    ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                     (failure_type *)in_stack_ffffffffffffd808);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6ead63);
          error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_1799);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_1771);
          source_location::~source_location(in_stack_ffffffffffffd810);
          region::~region((region *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_1669);
          local_104 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
          source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
          make_error_info<std::__cxx11::string>
                    (in_stack_ffffffffffffda08,in_stack_ffffffffffffda00,(string *)msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
          err<toml::error_info>
                    ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
          result<toml::value_t,_toml::error_info>::result
                    ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                     (failure_type *)in_stack_ffffffffffffd808);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6eb04a);
          error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_19a1);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_1979);
          source_location::~source_location(in_stack_ffffffffffffd810);
          region::~region((region *)in_stack_ffffffffffffd810);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd810);
          std::allocator<char>::~allocator(local_1871);
          local_104 = 1;
        }
      }
    }
  }
  else {
    local_104 = 0;
  }
  region::~region((region *)in_stack_ffffffffffffd810);
  if (local_104 == 0) {
    bVar4 = location::eof((location *)in_stack_ffffffffffffd810);
    if ((bVar4) ||
       (in_stack_ffffffffffffd86f = location::current((location *)in_stack_ffffffffffffd808),
       in_stack_ffffffffffffd86f != '.')) {
      bVar4 = location::eof((location *)in_stack_ffffffffffffd810);
      if ((bVar4) ||
         (in_stack_ffffffffffffd847 = location::current((location *)in_stack_ffffffffffffd808),
         in_stack_ffffffffffffd847 != '_')) {
        region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
        source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
        region::~region((region *)in_stack_ffffffffffffd810);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
        in_stack_ffffffffffffd810 = (source_location *)&stack0xffffffffffffda07;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        make_error_info<>(in_stack_ffffffffffffd9d8,in_stack_ffffffffffffd9d0,
                          (string *)
                          CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffd9ce,
                                                  in_stack_ffffffffffffd9c8)));
        f = local_24e0;
        err<toml::error_info>
                  ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
        result<toml::value_t,_toml::error_info>::result
                  ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,f);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6ebfec);
        error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffda07);
        source_location::~source_location(in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_2559);
        local_104 = 1;
        source_location::~source_location(in_stack_ffffffffffffd810);
      }
      else {
        region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
        source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
        region::~region((region *)in_stack_ffffffffffffd810);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840))
        ;
        make_error_info<std::__cxx11::string>
                  (in_stack_ffffffffffffda08,in_stack_ffffffffffffda00,(string *)msg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        err<toml::error_info>
                  ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
        result<toml::value_t,_toml::error_info>::result
                  ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                   (failure_type *)in_stack_ffffffffffffd808);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6ebd3e);
        error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_23a1);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_2379);
        source_location::~source_location(in_stack_ffffffffffffd810);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd810);
        std::allocator<char>::~allocator(local_22d9);
        local_104 = 1;
        source_location::~source_location(in_stack_ffffffffffffd810);
      }
    }
    else {
      region::region(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878);
      source_location::source_location(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888);
      region::~region((region *)in_stack_ffffffffffffd810);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
      source_location::source_location(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffd850,(char *)in_stack_ffffffffffffd848,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
      this = &local_2121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_stack_ffffffffffffd848,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840));
      make_error_info<std::__cxx11::string>
                (in_stack_ffffffffffffda08,in_stack_ffffffffffffda00,(string *)msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      err<toml::error_info>
                ((error_info *)CONCAT17(in_stack_ffffffffffffd86f,in_stack_ffffffffffffd868));
      result<toml::value_t,_toml::error_info>::result
                ((result<toml::value_t,_toml::error_info> *)in_stack_ffffffffffffd810,
                 (failure_type *)in_stack_ffffffffffffd808);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6eba0f);
      error_info::~error_info((error_info *)in_stack_ffffffffffffd810);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd810);
      std::allocator<char>::~allocator((allocator<char> *)&local_2121);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd810);
      std::allocator<char>::~allocator(local_20f9);
      source_location::~source_location(in_stack_ffffffffffffd810);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd810);
      std::allocator<char>::~allocator(local_2059);
      local_104 = 1;
      source_location::~source_location(in_stack_ffffffffffffd810);
    }
  }
LAB_006ec140:
  location::~location((location *)in_stack_ffffffffffffd810);
  return msg;
}

Assistant:

result<value_t, error_info>
guess_number_type(const location& first, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    location loc = first;

    if(syntax::offset_datetime(spec).scan(loc).is_ok())
    {
        return ok(value_t::offset_datetime);
    }
    loc = first;

    if(syntax::local_datetime(spec).scan(loc).is_ok())
    {
        const auto curr = loc.current();
        // if offset_datetime contains bad offset, it syntax::offset_datetime
        // fails to scan it.
        if(curr == '+' || curr == '-')
        {
            return err(make_syntax_error("bad offset: must be [+-]HH:MM or Z",
                syntax::time_offset(spec), loc, std::string(
                "Hint: valid  : +09:00, -05:30\n"
                "Hint: invalid: +9:00,  -5:30\n")));
        }
        return ok(value_t::local_datetime);
    }
    loc = first;

    if(syntax::local_date(spec).scan(loc).is_ok())
    {
        // bad time may appear after this.

        if( ! loc.eof())
        {
            const auto c = loc.current();
            if(c == 'T' || c == 't')
            {
                loc.advance();

                return err(make_syntax_error("bad time: must be HH:MM:SS.subsec",
                    syntax::local_time(spec), loc, std::string(
                    "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                    "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
            }
            if(c == ' ')
            {
                // A space is allowed as a delimiter between local time.
                // But there is a case where bad time follows a space.
                // - invalid: 2019-06-16 7:00:00
                // - valid  : 2019-06-16 07:00:00
                loc.advance();
                if( ! loc.eof() && ('0' <= loc.current() && loc.current() <= '9'))
                {
                    return err(make_syntax_error("bad time: must be HH:MM:SS.subsec",
                        syntax::local_time(spec), loc, std::string(
                        "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                        "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
                }
            }
            if('0' <= c && c <= '9')
            {
                return err(make_syntax_error("bad datetime: missing T or space",
                    character_either{'T', 't', ' '}, loc, std::string(
                    "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                    "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
            }
        }
        return ok(value_t::local_date);
    }
    loc = first;

    if(syntax::local_time(spec).scan(loc).is_ok())
    {
        return ok(value_t::local_time);
    }
    loc = first;

    if(syntax::floating(spec).scan(loc).is_ok())
    {
        if( ! loc.eof() && loc.current() == '_')
        {
            if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
            {
                return ok(value_t::floating);
            }
            auto src = source_location(region(loc));
            return err(make_error_info(
                "bad float: `_` must be surrounded by digits",
                std::move(src), "invalid underscore",
                "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"));
        }
        return ok(value_t::floating);
    }
    loc = first;

    if(spec.ext_hex_float)
    {
        if(syntax::hex_floating(spec).scan(loc).is_ok())
        {
            if( ! loc.eof() && loc.current() == '_')
            {
                if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
                {
                    return ok(value_t::floating);
                }
                auto src = source_location(region(loc));
                return err(make_error_info(
                    "bad float: `_` must be surrounded by digits",
                    std::move(src), "invalid underscore",
                    "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                    "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"));
            }
            return ok(value_t::floating);
        }
        loc = first;
    }

    if(auto int_reg = syntax::integer(spec).scan(loc))
    {
        if( ! loc.eof())
        {
            const auto c = loc.current();
            if(c == '_')
            {
                if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
                {
                    return ok(value_t::integer);
                }

                if(int_reg.length() <= 2 && (int_reg.as_string() == "0" ||
                    int_reg.as_string() == "-0" || int_reg.as_string() == "+0"))
                {
                    auto src = source_location(region(loc));
                    return err(make_error_info(
                        "bad integer: leading zero is not allowed in decimal int",
                        std::move(src), "leading zero",
                        "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                        "Hint: invalid: _42, 1__000, 0123\n"));
                }
                else
                {
                    auto src = source_location(region(loc));
                    return err(make_error_info(
                        "bad integer: `_` must be surrounded by digits",
                        std::move(src), "invalid underscore",
                        "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                        "Hint: invalid: _42, 1__000, 0123\n"));
                }
            }
            if('0' <= c && c <= '9')
            {
                if(loc.current() == '0')
                {
                    loc.retrace();
                    return err(make_error_info(
                        "bad integer: leading zero",
                        source_location(region(loc)), "leading zero is not allowed",
                        std::string("Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                                    "Hint: invalid: _42, 1__000, 0123\n")
                        ));
                }
                else // invalid digits, especially in oct/bin ints.
                {
                    return err(make_error_info(
                        "bad integer: invalid digit after an integer",
                        source_location(region(loc)), "this digit is not allowed",
                        std::string("Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                                    "Hint: invalid: _42, 1__000, 0123\n")
                        ));
                }
            }
            if(c == ':' || c == '-')
            {
                auto src = source_location(region(loc));
                return err(make_error_info("bad datetime: invalid format",
                    std::move(src), "here",
                    std::string("Hint: valid  : 1979-05-27T07:32:00-07:00, 1979-05-27 07:32:00.999999Z\n"
                                "Hint: invalid: 1979-05-27T7:32:00-7:00, 1979-05-27 7:32-00:30")
                    ));
            }
            if(c == '.' || c == 'e' || c == 'E')
            {
                auto src = source_location(region(loc));
                return err(make_error_info("bad float: invalid format",
                    std::move(src), "here", std::string(
                    "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                    "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n")));
            }
        }
        return ok(value_t::integer);
    }
    if( ! loc.eof() && loc.current() == '.')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("bad float: integer part is required before decimal point",
            std::move(src), "missing integer part", std::string(
            "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
            "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n")
            ));
    }
    if( ! loc.eof() && loc.current() == '_')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("bad number: `_` must be surrounded by digits",
            std::move(src), "digits required before `_`", std::string(
            "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
            "Hint: invalid: _42, 1__000, 0123\n")
            ));
    }

    auto src = source_location(region(loc));
    return err(make_error_info("bad format: unknown value appeared",
                std::move(src), "here"));
}